

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianOptimizationWrapC.cpp
# Opt level: O0

ObjectiveFunctionSingle *
TasOptimization::convert_C_obj_fn_single
          (ObjectiveFunctionSingle *__return_storage_ptr__,tsg_optim_obj_fn_single func_ptr,
          string *err_msg)

{
  anon_class_40_2_d961b61f local_48;
  string *local_20;
  string *err_msg_local;
  tsg_optim_obj_fn_single func_ptr_local;
  
  local_48.func_ptr = func_ptr;
  local_20 = err_msg;
  err_msg_local = (string *)func_ptr;
  func_ptr_local = (tsg_optim_obj_fn_single)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_48.err_msg,(string *)err_msg);
  std::function<double(std::vector<double,std::allocator<double>>const&)>::
  function<TasOptimization::convert_C_obj_fn_single(double(*)(int,double_const*,int*),std::__cxx11::string)::__0,void>
            ((function<double(std::vector<double,std::allocator<double>>const&)> *)
             __return_storage_ptr__,&local_48);
  convert_C_obj_fn_single(double(*)(int,double_const*,int*),std::__cxx11::string)::$_0::~__0
            ((__0 *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

ObjectiveFunctionSingle convert_C_obj_fn_single(tsg_optim_obj_fn_single func_ptr, std::string err_msg) {
    return [=](const std::vector<double> &x_single)->double {
        int err_code = 0;
        int num_dims = x_single.size();
        double result = (*func_ptr)(num_dims, x_single.data(), &err_code);
        if (err_code != 0) throw std::runtime_error(err_msg);
        return result;
    };
}